

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::AppendAllocableHeapBlockList
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  Recycler *pRVar4;
  ConfigFlagsTable *pCVar5;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  undefined8 *in_FS_OFFSET;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *currentHeapBlockList;
  CollectionState collectionState;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list_local;
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_local;
  
  pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
  pCVar5 = Recycler::GetRecyclerFlagsTable(pRVar4);
  bVar2 = Js::Phases::IsEnabled(&pCVar5->Trace,ConcurrentSweepPhase);
  if ((bVar2) && ((Js::Configuration::Global[0x291a2] & 1) != 0)) {
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    CVar3 = ObservableValue::operator_cast_to_CollectionState
                      ((ObservableValue *)&pRVar4->collectionState);
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    Output::Print(L"[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"
                  ,(ulong)pRVar4->collectionCount,this,(ulong)CVar3);
  }
  if (this->heapBlockList ==
      (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    this->heapBlockList = list;
    this->nextAllocableBlockHead = list;
  }
  else {
    this_00 = &HeapBlockList::
               Tail<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                         (this->heapBlockList)->
               super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>;
    if (this_00 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x738,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock
              (this_00,&list->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>);
    if (this->nextAllocableBlockHead ==
        (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this->nextAllocableBlockHead = list;
    }
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AppendAllocableHeapBlockList(TBlockType * list)
{
#ifdef RECYCLER_TRACE
    if (this->GetRecycler()->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
    {
        CollectionState collectionState = this->GetRecycler()->collectionState;
        Output::Print(_u("[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"), this->GetRecycler()->collectionCount, this, collectionState);
    }
#endif
    // Add the list to the end of the current list
    TBlockType * currentHeapBlockList = this->heapBlockList;
    if (currentHeapBlockList == nullptr)
    {
        // There weren't any heap block list before, just move the list over and start allocate from it
        this->heapBlockList = list;
        this->nextAllocableBlockHead = list;
    }
    else
    {
        // Find the last block and append the list
        TBlockType * tail = HeapBlockList::Tail(currentHeapBlockList);
        Assert(tail != nullptr);
        tail->SetNextBlock(list);

        // If we are not currently allocating from the existing heapBlockList,
        // that means fill all the exiting one already, we should start with what we just appended.
        if (this->nextAllocableBlockHead == nullptr)
        {
            this->nextAllocableBlockHead = list;
        }
    }
}